

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O3

uint32_t chck_hash_table_collisions(chck_hash_table *table)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  chck_hash_table *pcVar5;
  uint32_t uVar6;
  size_t sVar7;
  long lVar8;
  
  if (table == (chck_hash_table *)0x0) {
    __assert_fail("table",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x157,"uint32_t chck_hash_table_collisions(struct chck_hash_table *)");
  }
  pcVar5 = table->next;
  if (pcVar5 == (chck_hash_table *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    do {
      sVar1 = (pcVar5->meta).count;
      uVar4 = uVar6;
      if (sVar1 != 0) {
        puVar2 = (pcVar5->meta).table;
        sVar7 = 0;
        uVar3 = uVar6;
        do {
          uVar4 = uVar6;
          if (puVar2 == (uint8_t *)0x0) break;
          lVar8 = (pcVar5->meta).member * sVar7;
          sVar7 = sVar7 + 1;
          uVar3 = uVar3 + puVar2[lVar8];
          uVar4 = uVar3;
        } while (sVar1 != sVar7);
      }
      pcVar5 = pcVar5->next;
      uVar6 = uVar4;
    } while (pcVar5 != (chck_hash_table *)0x0);
  }
  return uVar4;
}

Assistant:

uint32_t
chck_hash_table_collisions(struct chck_hash_table *table)
{
   assert(table);

   uint32_t collisions = 0;
   for (struct chck_hash_table *t = table->next; t; t = t->next) {
      struct header *hdr;
      chck_lut_for_each(&t->meta, hdr) {
         if (hdr->placed)
            ++collisions;
      }
   }

   return collisions;
}